

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

size_type __thiscall
ft::multimap<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::erase
          (multimap<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          key_type *k)

{
  size_type sVar1;
  undefined1 local_c0 [8];
  iterator first;
  iterator last;
  treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  local_78;
  iterator local_60;
  iterator local_48;
  
  mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::lower_bound
            ((iterator *)local_c0,
             &this->
              super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>,k);
  mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::upper_bound
            ((iterator *)&first.m_node,
             &this->
              super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>,k);
  last.m_node = (treeNode<ft::pair<const_int,_int>_> *)&PTR__treeIterator_001188a0;
  local_78._vptr_treeIterator = (_func_int **)&PTR__treeIterator_001188a0;
  local_78.m_tree =
       (RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_> *
       )last._vptr_treeIterator;
  local_78.m_node = (treeNode<ft::pair<const_int,_int>_> *)last.m_tree;
  sVar1 = distance<ft::treeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>>
                    ((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                      *)&last.m_node,&local_78,(type *)0x0);
  local_60._vptr_treeIterator = (_func_int **)&PTR__treeIterator_001188a0;
  local_60.m_tree =
       (RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_> *
       )first._vptr_treeIterator;
  local_60.m_node = (treeNode<ft::pair<const_int,_int>_> *)first.m_tree;
  local_48._vptr_treeIterator = (_func_int **)&PTR__treeIterator_001188a0;
  local_48.m_tree =
       (RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_> *
       )last._vptr_treeIterator;
  local_48.m_node = (treeNode<ft::pair<const_int,_int>_> *)last.m_tree;
  erase(this,&local_60,&local_48);
  return sVar1;
}

Assistant:

size_type	erase(key_type const & k)
	{
		iterator	first = this->lower_bound(k);
		iterator	last = this->upper_bound(k);
		size_type	ret = ft::distance(first, last);

		this->erase(first, last);
		return ret;
	}